

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

int __thiscall FIX::CheckSumField::getValue(CheckSumField *this)

{
  int iVar1;
  
  iVar1 = IntTConvertor<int>::convert(&(this->super_FieldBase).m_string);
  return iVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return CheckSumConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }